

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QPodArrayOps<QCheckPoint>::emplace<QCheckPoint_const&>
          (QPodArrayOps<QCheckPoint> *this,qsizetype i,QCheckPoint *args)

{
  QCheckPoint **ppQVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  long lVar4;
  QCheckPoint *pQVar5;
  QFixed QVar6;
  QFixed QVar7;
  int iVar8;
  QFixed QVar9;
  QFixed QVar10;
  QFixed QVar11;
  QCheckPoint *pQVar12;
  GrowthPosition where;
  
  pDVar3 = (this->super_QArrayDataPointer<QCheckPoint>).d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
LAB_005012ea:
    QVar6.val = (args->y).val;
    QVar7.val = (args->frameY).val;
    iVar8 = args->positionInFrame;
    QVar9.val = (args->minimumWidth).val;
    QVar10.val = (args->maximumWidth).val;
    QVar11.val = (args->contentsWidth).val;
    where = (GrowthPosition)(i == 0 && (this->super_QArrayDataPointer<QCheckPoint>).size != 0);
    QArrayDataPointer<QCheckPoint>::detachAndGrow
              (&this->super_QArrayDataPointer<QCheckPoint>,where,1,(QCheckPoint **)0x0,
               (QArrayDataPointer<QCheckPoint> *)0x0);
    pQVar12 = createHole(this,where,i,1);
    pQVar12->y = (QFixed)QVar6.val;
    pQVar12->frameY = (QFixed)QVar7.val;
    pQVar12->positionInFrame = iVar8;
    pQVar12->minimumWidth = (QFixed)QVar9.val;
    pQVar12->maximumWidth = (QFixed)QVar10.val;
    pQVar12->contentsWidth = (QFixed)QVar11.val;
  }
  else {
    lVar4 = (this->super_QArrayDataPointer<QCheckPoint>).size;
    if ((lVar4 == i && pDVar3 != (Data *)0x0) &&
       ((pDVar3->super_QArrayData).alloc - lVar4 !=
        ((long)((long)(this->super_QArrayDataPointer<QCheckPoint>).ptr -
               ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) *
        -0x5555555555555555)) {
      pQVar12 = (this->super_QArrayDataPointer<QCheckPoint>).ptr;
      QVar6.val = (args->contentsWidth).val;
      pQVar5 = pQVar12 + lVar4;
      pQVar5->maximumWidth = (QFixed)(args->maximumWidth).val;
      pQVar5->contentsWidth = (QFixed)QVar6.val;
      QVar6.val = (args->frameY).val;
      iVar8 = args->positionInFrame;
      QVar7.val = (args->minimumWidth).val;
      pQVar12 = pQVar12 + lVar4;
      pQVar12->y = (QFixed)(args->y).val;
      pQVar12->frameY = (QFixed)QVar6.val;
      pQVar12->positionInFrame = iVar8;
      pQVar12->minimumWidth = (QFixed)QVar7.val;
    }
    else {
      if (((i != 0) || (pDVar3 == (Data *)0x0)) ||
         ((QCheckPoint *)
          ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) ==
          (this->super_QArrayDataPointer<QCheckPoint>).ptr)) goto LAB_005012ea;
      pQVar12 = (this->super_QArrayDataPointer<QCheckPoint>).ptr;
      QVar6.val = (args->contentsWidth).val;
      pQVar12[-1].maximumWidth = (QFixed)(args->maximumWidth).val;
      pQVar12[-1].contentsWidth = (QFixed)QVar6.val;
      QVar6.val = (args->frameY).val;
      iVar8 = args->positionInFrame;
      QVar7.val = (args->minimumWidth).val;
      pQVar12[-1].y = (QFixed)(args->y).val;
      pQVar12[-1].frameY = (QFixed)QVar6.val;
      pQVar12[-1].positionInFrame = iVar8;
      pQVar12[-1].minimumWidth = (QFixed)QVar7.val;
      ppQVar1 = &(this->super_QArrayDataPointer<QCheckPoint>).ptr;
      *ppQVar1 = *ppQVar1 + -1;
    }
    pqVar2 = &(this->super_QArrayDataPointer<QCheckPoint>).size;
    *pqVar2 = *pqVar2 + 1;
  }
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }